

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_inplace_negation_helper(_Bool runopt,uint32_t gap)

{
  int iVar1;
  roaring_bitmap_t *prVar2;
  uint64_t uVar3;
  char *expression;
  roaring_bitmap_t *r;
  uint in_ESI;
  byte in_DIL;
  roaring_bitmap_t *r1_orig;
  int orig_card;
  _Bool hasrun;
  uint32_t i;
  roaring_bitmap_t *r1;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  roaring_bitmap_t *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  roaring_bitmap_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint val;
  
  prVar2 = roaring_bitmap_create();
  _assert_true((unsigned_long)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  for (val = 0; val < 0x10000; val = val + 1) {
    if (in_ESI <= val % 0x93) {
      roaring_bitmap_add(prVar2,val);
      roaring_bitmap_add(prVar2,val);
    }
  }
  if ((in_DIL & 1) != 0) {
    roaring_bitmap_run_optimize(in_stack_ffffffffffffffc0);
    _assert_true((unsigned_long)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 (char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  uVar3 = roaring_bitmap_get_cardinality(in_stack_ffffffffffffffc0);
  iVar1 = (int)uVar3;
  roaring_bitmap_copy((roaring_bitmap_t *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  roaring_bitmap_flip_inplace
            (in_stack_ffffffffffffffb0,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
             ,0x109668);
  _assert_true((unsigned_long)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  roaring_bitmap_get_cardinality(in_stack_ffffffffffffffc0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffffc0,
                    (unsigned_long)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                    in_stack_ffffffffffffffac);
  roaring_bitmap_free((roaring_bitmap_t *)0x1096b2);
  roaring_bitmap_copy((roaring_bitmap_t *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  roaring_bitmap_flip_inplace
            (in_stack_ffffffffffffffb0,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
             ,0x1096d4);
  _assert_true((unsigned_long)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  prVar2 = (roaring_bitmap_t *)(long)(1000000 - iVar1);
  roaring_bitmap_get_cardinality(in_stack_ffffffffffffffc0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffffc0,
                    (unsigned_long)in_stack_ffffffffffffffb8,(char *)prVar2,
                    in_stack_ffffffffffffffac);
  roaring_bitmap_free((roaring_bitmap_t *)0x10972e);
  roaring_bitmap_copy((roaring_bitmap_t *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  roaring_bitmap_flip_inplace
            (prVar2,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0x109751);
  _assert_true((unsigned_long)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(char *)prVar2,
               in_stack_ffffffffffffffac);
  expression = (char *)(long)(iVar1 + 100000);
  roaring_bitmap_get_cardinality(in_stack_ffffffffffffffc0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffffc0,(unsigned_long)expression,
                    (char *)prVar2,in_stack_ffffffffffffffac);
  roaring_bitmap_free((roaring_bitmap_t *)0x1097ab);
  roaring_bitmap_copy((roaring_bitmap_t *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  roaring_bitmap_flip_inplace
            (prVar2,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0x1097ce);
  _assert_true((unsigned_long)in_stack_ffffffffffffffc0,expression,(char *)prVar2,
               in_stack_ffffffffffffffac);
  r = (roaring_bitmap_t *)(long)(0x5ffff - iVar1);
  roaring_bitmap_get_cardinality(r);
  _assert_int_equal((unsigned_long)r,(unsigned_long)expression,(char *)prVar2,
                    in_stack_ffffffffffffffac);
  roaring_bitmap_free((roaring_bitmap_t *)0x109828);
  roaring_bitmap_copy((roaring_bitmap_t *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  roaring_bitmap_flip_inplace
            (prVar2,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0x10984b);
  _assert_true((unsigned_long)r,expression,(char *)prVar2,in_stack_ffffffffffffffac);
  roaring_bitmap_get_cardinality(r);
  _assert_int_equal((unsigned_long)r,(unsigned_long)expression,(char *)prVar2,
                    in_stack_ffffffffffffffac);
  roaring_bitmap_free((roaring_bitmap_t *)0x1098c9);
  roaring_bitmap_free((roaring_bitmap_t *)0x1098d3);
  return;
}

Assistant:

void test_inplace_negation_helper(bool runopt, uint32_t gap) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    assert_non_null(r1);

    for (uint32_t i = 0; i < 65536; ++i) {
        if (i % 147 < gap) continue;
        roaring_bitmap_add(r1, i);
        roaring_bitmap_add(r1, 5 * 65536 + i);
    }
    if (runopt) {
        bool hasrun = roaring_bitmap_run_optimize(r1);
        assert_true(hasrun);
    }

    int orig_card = (int)roaring_bitmap_get_cardinality(r1);
    roaring_bitmap_t *r1_orig = roaring_bitmap_copy(r1);

    // get the first batch of ones but not the second
    roaring_bitmap_flip_inplace(r1, 0U, 100000U);
    assert_non_null(r1);

    // lose some for key 0, but gain same num for key 5
    assert_int_equal(100000, roaring_bitmap_get_cardinality(r1));
    roaring_bitmap_free(r1);

    // flip all ones and beyond
    r1 = roaring_bitmap_copy(r1_orig);
    roaring_bitmap_flip_inplace(r1, 0U, 1000000U);
    assert_non_null(r1);
    assert_int_equal(1000000 - orig_card, roaring_bitmap_get_cardinality(r1));
    roaring_bitmap_free(r1);

    // Flip some bits in the middle
    r1 = roaring_bitmap_copy(r1_orig);
    roaring_bitmap_flip_inplace(r1, 100000U, 200000U);
    assert_non_null(r1);
    assert_int_equal(100000 + orig_card, roaring_bitmap_get_cardinality(r1));
    roaring_bitmap_free(r1);

    // flip almost all of the bits, end at an even boundary
    r1 = roaring_bitmap_copy(r1_orig);
    roaring_bitmap_flip_inplace(r1, 1U, 65536 * 6);
    assert_non_null(r1);
    assert_int_equal((65536 * 6 - 1) - orig_card,
                     roaring_bitmap_get_cardinality(r1));
    roaring_bitmap_free(r1);

    // flip first bunch of the bits, end at an even boundary
    r1 = roaring_bitmap_copy(r1_orig);
    roaring_bitmap_flip_inplace(r1, 1U, 65536 * 5);
    assert_non_null(r1);
    assert_int_equal(65536 * 5 - 1 - (orig_card / 2) + (orig_card / 2),
                     roaring_bitmap_get_cardinality(r1));
    roaring_bitmap_free(r1);

    roaring_bitmap_free(r1_orig);
}